

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

bool __thiscall
ON_Mesh::SeparateNgons(ON_Mesh *this,uint **vertex_face_map,uint ngon_index0,uint ngon_index1)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  ON_MeshSeparateNgonInfo X;
  ON_MeshSeparateNgonInfo local_e8;
  
  uVar2 = (this->m_Ngon).m_count;
  if (uVar2 < ngon_index1) {
    ngon_index1 = uVar2;
  }
  if (ngon_index0 < ngon_index1) {
    ON_MeshSeparateNgonInfo::ON_MeshSeparateNgonInfo(&local_e8,this,vertex_face_map);
    bVar3 = false;
    bVar1 = false;
    if ((((local_e8.m_mesh != (ON_Mesh *)0x0) && (bVar1 = bVar3, 3 < local_e8.m_vertex_count0)) &&
        (1 < local_e8.m_face_count)) &&
       ((local_e8.m_vertex_face_map != (uint **)0x0 &&
        (local_e8.m_ngondex_from_facedex_map != (uint *)0x0)))) {
      do {
        bVar1 = ON_MeshSeparateNgonInfo::FindSharedNgonVertices(&local_e8,ngon_index0);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00529c3f;
        }
        ngon_index0 = ngon_index0 + 1;
      } while (ngon_index1 != ngon_index0);
      if (local_e8.m_vertex_count0 < local_e8.m_vertex_count1) {
        ON_MeshSeparateNgonInfo::DuplicateSharedNgonVertices(&local_e8);
      }
      uVar2 = VertexUnsignedCount(this);
      bVar1 = local_e8.m_vertex_count0 < uVar2;
    }
LAB_00529c3f:
    ON_FixedSizePool::~ON_FixedSizePool(&local_e8.m_virefpool);
    ON_MeshVertexFaceMap::~ON_MeshVertexFaceMap(&local_e8.m_local_vfmap);
    ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_e8.m_ngon_vmap_buffer);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Mesh::SeparateNgons(
  unsigned int** vertex_face_map,
  unsigned int ngon_index0,
  unsigned int ngon_index1
  )
{
  if ( ngon_index1 > NgonUnsignedCount() )
    ngon_index1 = NgonUnsignedCount();
  if ( ngon_index1 <= ngon_index0 )
    return false;

  ON_MeshSeparateNgonInfo X(this,vertex_face_map);
  if ( false == X.IsValid() )
    return false;

  // Count number of new vertices that are required
  // to separate the ngons and save a list of what
  // needs to be updated in "X".  This loop modifies
  // vertex_face_map[] by removing references
  // to faces of vertices that will be duplicated.
  for ( unsigned int ni = ngon_index0; ni < ngon_index1; ni++ )
  {
    if( false == X.FindSharedNgonVertices(ni) )
      return 0;
  }

  // Add new vertices to ngons.
  if ( X.m_vertex_count1 > X.m_vertex_count0 )
  {
    // Duplicate the shared vertices and update the
    // ngon and face vertex index lists to reference
    // the duplicated vertices.
    X.DuplicateSharedNgonVertices();
  }

  return (VertexUnsignedCount() > X.m_vertex_count0);
}